

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyHashInit(SyHash *pHash,SyMemBackend *pAllocator,ProcHash xHash,ProcCmp xCmp)

{
  SyHashEntry_Pr **pSrc;
  code *pcVar1;
  
  pSrc = (SyHashEntry_Pr **)SyMemBackendAlloc(pAllocator,0x80);
  pcVar1 = (code *)pSrc;
  if (pSrc != (SyHashEntry_Pr **)0x0) {
    SyZero(pSrc,0x80);
    pHash->pAllocator = pAllocator;
    pHash->xHash = SyBinHash;
    pcVar1 = SyMemcmp;
    pHash->xCmp = SyMemcmp;
    pHash->nEntry = 0;
    pHash->pList = (SyHashEntry_Pr *)0x0;
    pHash->pCurrent = (SyHashEntry_Pr *)0x0;
    pHash->apBucket = pSrc;
    pHash->nBucketSize = 0x10;
  }
  return (sxi32)pcVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyHashInit(SyHash *pHash, SyMemBackend *pAllocator, ProcHash xHash, ProcCmp xCmp)
{
	SyHashEntry_Pr **apNew;
#if defined(UNTRUST)
	if( pHash == 0 ){
		return SXERR_EMPTY;
	}
#endif
	/* Allocate a new table */
	apNew = (SyHashEntry_Pr **)SyMemBackendAlloc(&(*pAllocator), sizeof(SyHashEntry_Pr *) * SXHASH_BUCKET_SIZE);
	if( apNew == 0 ){
		return SXERR_MEM;
	}
	SyZero((void *)apNew, sizeof(SyHashEntry_Pr *) * SXHASH_BUCKET_SIZE);
	pHash->pAllocator = &(*pAllocator);
	pHash->xHash = xHash ? xHash : SyBinHash;
	pHash->xCmp = xCmp ? xCmp : SyMemcmp;
	pHash->pCurrent = pHash->pList = 0;
	pHash->nEntry = 0;
	pHash->apBucket = apNew;
	pHash->nBucketSize = SXHASH_BUCKET_SIZE;
	return SXRET_OK;
}